

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_ge *pre_a,secp256k1_fe *zr,secp256k1_fe *z,secp256k1_gej *a)

{
  ulong *puVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  ulong uVar89;
  ulong uVar90;
  long extraout_RDX;
  ulong uVar91;
  secp256k1_fe *a_00;
  secp256k1_fe *a_01;
  ulong uVar92;
  ulong uVar93;
  secp256k1_ge *a_02;
  ulong uVar94;
  secp256k1_gej *a_03;
  secp256k1_gej *psVar95;
  undefined4 in_register_0000003c;
  secp256k1_ge *r;
  ulong uVar96;
  secp256k1_gej *a_04;
  secp256k1_fe *psVar97;
  ulong uVar98;
  long lVar99;
  secp256k1_fe *a_05;
  undefined1 *puVar100;
  secp256k1_gej ai;
  secp256k1_gej d;
  secp256k1_ge d_ge;
  secp256k1_fe sStack_360;
  secp256k1_fe sStack_330;
  secp256k1_fe *psStack_300;
  secp256k1_fe *psStack_2f8;
  secp256k1_fe *psStack_2f0;
  undefined1 *puStack_2e8;
  secp256k1_gej *psStack_2e0;
  secp256k1_ge *psStack_2d8;
  undefined1 *puStack_2c8;
  undefined1 *puStack_2c0;
  secp256k1_fe *psStack_2b8;
  undefined1 auStack_2b0 [128];
  ulong uStack_230;
  ulong uStack_228;
  ulong uStack_220;
  long lStack_218;
  undefined8 uStack_210;
  secp256k1_gej local_1c8;
  secp256k1_gej local_130;
  secp256k1_ge local_98;
  
  r = (secp256k1_ge *)CONCAT44(in_register_0000003c,n);
  if ((int)z[3].n[0] == 0) {
    secp256k1_gej_double_var(&local_130,(secp256k1_gej *)z,(secp256k1_fe *)0x0);
    secp256k1_ge_set_xy(&local_98,&local_130.x,&local_130.y);
    secp256k1_ge_set_gej_zinv(r,(secp256k1_gej *)z,&local_130.z);
    secp256k1_gej_set_ge(&local_1c8,r);
    local_1c8.z.n[0] = z[2].n[0];
    local_1c8.z.n[1] = z[2].n[1];
    local_1c8.z.n[2] = z[2].n[2];
    local_1c8.z.n[3] = z[2].n[3];
    local_1c8.z.n[4] = z[2].n[4];
    local_1c8.z.magnitude = z[2].magnitude;
    local_1c8.z.normalized = z[2].normalized;
    (pre_a->x).n[4] = local_130.z.n[4];
    (pre_a->x).magnitude = local_130.z.magnitude;
    (pre_a->x).normalized = local_130.z.normalized;
    (pre_a->x).n[2] = local_130.z.n[2];
    (pre_a->x).n[3] = local_130.z.n[3];
    (pre_a->x).n[0] = local_130.z.n[0];
    (pre_a->x).n[1] = local_130.z.n[1];
    lVar99 = 0x30;
    do {
      r = r + 1;
      secp256k1_gej_add_ge_var
                (&local_1c8,&local_1c8,&local_98,(secp256k1_fe *)((long)(pre_a->x).n + lVar99));
      secp256k1_ge_set_xy(r,&local_1c8.x,&local_1c8.y);
      lVar99 = lVar99 + 0x30;
    } while (lVar99 != 0xc0);
    secp256k1_fe_mul(zr,&local_1c8.z,&local_130.z);
    return;
  }
  secp256k1_ecmult_odd_multiples_table_cold_1();
  puVar100 = &r[-1].field_0x67;
  if (r != (secp256k1_ge *)0x0) {
    psStack_2d8 = (secp256k1_ge *)0x11d73e;
    puStack_2c8 = puVar100;
    secp256k1_ge_verify(pre_a + (long)puVar100);
    a_05 = (secp256k1_fe *)((long)puVar100 * 0x30);
    psStack_2d8 = (secp256k1_ge *)0x11d756;
    secp256k1_fe_verify((secp256k1_fe *)((long)a_05->n + extraout_RDX));
    psVar97 = &pre_a[(long)puVar100].y;
    psStack_2d8 = (secp256k1_ge *)0x11d765;
    secp256k1_fe_verify(psVar97);
    uVar92 = pre_a[(long)puVar100].y.n[4];
    uVar91 = (uVar92 >> 0x30) * 0x1000003d1 + psVar97->n[0];
    uVar89 = (uVar91 >> 0x34) + pre_a[(long)puVar100].y.n[1];
    uVar94 = (uVar89 >> 0x34) + pre_a[(long)puVar100].y.n[2];
    uVar96 = (uVar94 >> 0x34) + pre_a[(long)puVar100].y.n[3];
    a_03 = (secp256k1_gej *)(uVar94 & 0xfffffffffffff);
    psVar97->n[0] = uVar91 & 0xfffffffffffff;
    pre_a[(long)puVar100].y.n[1] = uVar89 & 0xfffffffffffff;
    pre_a[(long)puVar100].y.n[2] = (uint64_t)a_03;
    pre_a[(long)puVar100].y.n[3] = uVar96 & 0xfffffffffffff;
    pre_a[(long)puVar100].y.n[4] = (uVar96 >> 0x34) + (uVar92 & 0xffffffffffff);
    pre_a[(long)puVar100].y.magnitude = 1;
    psStack_2d8 = (secp256k1_ge *)0x11d7fa;
    secp256k1_fe_verify(psVar97);
    puVar1 = (ulong *)((long)a_05->n + extraout_RDX);
    auStack_2b0._0_8_ = *puVar1;
    auStack_2b0._8_8_ = puVar1[1];
    puVar1 = (ulong *)((long)a_05->n + extraout_RDX + 0x10);
    auStack_2b0._16_8_ = *puVar1;
    auStack_2b0._24_8_ = puVar1[1];
    puVar1 = (ulong *)((long)a_05->n + extraout_RDX + 0x20);
    auStack_2b0._32_8_ = *puVar1;
    auStack_2b0._40_8_ = puVar1[1];
    if (puVar100 != (undefined1 *)0x0) {
      a_02 = pre_a + (long)&r[-1].field_0x66;
      a_01 = (secp256k1_fe *)(extraout_RDX + (long)r * 0x30);
      puVar100 = (undefined1 *)0x0;
      do {
        a_01 = a_01 + -1;
        psStack_2d8 = (secp256k1_ge *)0x11d851;
        secp256k1_fe_verify(a_01);
        psStack_2d8 = (secp256k1_ge *)0x11d85a;
        secp256k1_ge_verify(a_02 + 1);
        if (puVar100 != (undefined1 *)0x0) {
          psStack_2d8 = (secp256k1_ge *)0x11d86d;
          a_03 = (secp256k1_gej *)auStack_2b0;
          secp256k1_fe_mul((secp256k1_fe *)auStack_2b0,(secp256k1_fe *)auStack_2b0,a_01);
        }
        psStack_2d8 = (secp256k1_ge *)0x11d875;
        secp256k1_ge_verify(a_02);
        psStack_2d8 = (secp256k1_ge *)0x11d87d;
        a_04 = (secp256k1_gej *)auStack_2b0;
        secp256k1_fe_verify((secp256k1_fe *)auStack_2b0);
        if (a_02->infinity != 0) {
          psStack_2d8 = (secp256k1_ge *)0x11db64;
          secp256k1_ge_table_set_globalz_cold_1();
LAB_0011db64:
          psStack_2d8 = (secp256k1_ge *)secp256k1_ge_set_gej_zinv;
          secp256k1_ge_table_set_globalz_cold_2();
          psVar95 = a_03;
          psStack_300 = a_01;
          psStack_2f8 = psVar97;
          psStack_2f0 = a_05;
          puStack_2e8 = puVar100;
          psStack_2e0 = (secp256k1_gej *)auStack_2b0;
          psStack_2d8 = a_02;
          secp256k1_gej_verify(a_03);
          psVar97 = a_00;
          secp256k1_fe_verify(a_00);
          if (a_03->infinity == 0) {
            psVar97 = a_00;
            secp256k1_fe_verify(a_00);
            if (a_00->magnitude < 9) {
              uVar92 = a_00->n[0];
              uVar89 = a_00->n[1];
              uVar91 = a_00->n[2];
              uVar94 = a_00->n[3];
              uVar96 = a_00->n[4];
              auVar23._8_8_ = 0;
              auVar23._0_8_ = uVar92 * 2;
              auVar59._8_8_ = 0;
              auVar59._0_8_ = uVar94;
              auVar24._8_8_ = 0;
              auVar24._0_8_ = uVar89 * 2;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = uVar91;
              auVar25._8_8_ = 0;
              auVar25._0_8_ = uVar96;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = uVar96;
              uVar90 = SUB168(auVar25 * auVar61,0);
              auVar26._8_8_ = 0;
              auVar26._0_8_ = uVar90 & 0xfffffffffffff;
              auVar23 = auVar24 * auVar60 + auVar23 * auVar59 + auVar26 * ZEXT816(0x1000003d10);
              uVar93 = auVar23._0_8_;
              sStack_360.n[0] = uVar93 & 0xfffffffffffff;
              auVar82._8_8_ = 0;
              auVar82._0_8_ = uVar93 >> 0x34 | auVar23._8_8_ << 0xc;
              uVar96 = uVar96 * 2;
              auVar27._8_8_ = 0;
              auVar27._0_8_ = uVar92;
              auVar62._8_8_ = 0;
              auVar62._0_8_ = uVar96;
              auVar28._8_8_ = 0;
              auVar28._0_8_ = uVar89 * 2;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = uVar94;
              auVar29._8_8_ = 0;
              auVar29._0_8_ = uVar91;
              auVar64._8_8_ = 0;
              auVar64._0_8_ = uVar91;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = uVar90 >> 0x34 | SUB168(auVar25 * auVar61,8) << 0xc;
              auVar23 = auVar27 * auVar62 + auVar82 + auVar28 * auVar63 + auVar29 * auVar64 +
                        auVar30 * ZEXT816(0x1000003d10);
              uVar90 = auVar23._0_8_;
              auVar83._8_8_ = 0;
              auVar83._0_8_ = uVar90 >> 0x34 | auVar23._8_8_ << 0xc;
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar92;
              auVar65._8_8_ = 0;
              auVar65._0_8_ = uVar92;
              auVar32._8_8_ = 0;
              auVar32._0_8_ = uVar89;
              auVar66._8_8_ = 0;
              auVar66._0_8_ = uVar96;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = uVar91 * 2;
              auVar67._8_8_ = 0;
              auVar67._0_8_ = uVar94;
              auVar23 = auVar32 * auVar66 + auVar83 + auVar33 * auVar67;
              uVar93 = auVar23._0_8_;
              auVar85._8_8_ = 0;
              auVar85._0_8_ = uVar93 >> 0x34 | auVar23._8_8_ << 0xc;
              auVar68._8_8_ = 0;
              auVar68._0_8_ = (uVar93 & 0xfffffffffffff) << 4 | (uVar90 & 0xfffffffffffff) >> 0x30;
              auVar23 = auVar31 * auVar65 + ZEXT816(0x1000003d1) * auVar68;
              uVar93 = auVar23._0_8_;
              sStack_330.n[0] = uVar93 & 0xfffffffffffff;
              auVar84._8_8_ = 0;
              auVar84._0_8_ = uVar93 >> 0x34 | auVar23._8_8_ << 0xc;
              auVar34._8_8_ = 0;
              auVar34._0_8_ = uVar92 * 2;
              auVar69._8_8_ = 0;
              auVar69._0_8_ = uVar89;
              auVar35._8_8_ = 0;
              auVar35._0_8_ = uVar91;
              auVar70._8_8_ = 0;
              auVar70._0_8_ = uVar96;
              auVar36._8_8_ = 0;
              auVar36._0_8_ = uVar94;
              auVar71._8_8_ = 0;
              auVar71._0_8_ = uVar94;
              auVar24 = auVar35 * auVar70 + auVar85 + auVar36 * auVar71;
              uVar93 = auVar24._0_8_;
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar93 & 0xfffffffffffff;
              auVar23 = auVar34 * auVar69 + auVar84 + auVar37 * ZEXT816(0x1000003d10);
              uVar98 = auVar23._0_8_;
              auVar87._8_8_ = 0;
              auVar87._0_8_ = uVar93 >> 0x34 | auVar24._8_8_ << 0xc;
              sStack_330.n[1] = uVar98 & 0xfffffffffffff;
              auVar86._8_8_ = 0;
              auVar86._0_8_ = uVar98 >> 0x34 | auVar23._8_8_ << 0xc;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = uVar92 * 2;
              auVar72._8_8_ = 0;
              auVar72._0_8_ = uVar91;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = uVar89;
              auVar73._8_8_ = 0;
              auVar73._0_8_ = uVar89;
              auVar40._8_8_ = 0;
              auVar40._0_8_ = uVar94;
              auVar74._8_8_ = 0;
              auVar74._0_8_ = uVar96;
              auVar87 = auVar40 * auVar74 + auVar87;
              uVar92 = auVar87._0_8_;
              auVar41._8_8_ = 0;
              auVar41._0_8_ = uVar92 & 0xfffffffffffff;
              auVar23 = auVar38 * auVar72 + auVar86 + auVar39 * auVar73 +
                        auVar41 * ZEXT816(0x1000003d10);
              uVar89 = auVar23._0_8_;
              sStack_330.n[2] = uVar89 & 0xfffffffffffff;
              auVar88._8_8_ = 0;
              auVar88._0_8_ = (uVar89 >> 0x34 | auVar23._8_8_ << 0xc) + sStack_360.n[0];
              auVar42._8_8_ = 0;
              auVar42._0_8_ = uVar92 >> 0x34 | auVar87._8_8_ << 0xc;
              auVar88 = auVar42 * ZEXT816(0x1000003d10) + auVar88;
              uVar92 = auVar88._0_8_;
              sStack_330.n[3] = uVar92 & 0xfffffffffffff;
              sStack_330.n[4] = (uVar92 >> 0x34 | auVar88._8_8_ << 0xc) + (uVar90 & 0xffffffffffff);
              sStack_330.magnitude = 1;
              sStack_330.normalized = 0;
              secp256k1_fe_verify(&sStack_330);
              secp256k1_fe_mul(&sStack_360,&sStack_330,a_00);
              secp256k1_fe_mul(&a_04->x,&a_03->x,&sStack_330);
              secp256k1_fe_mul(&a_04->y,&a_03->y,&sStack_360);
              *(int *)(a_04->z).n = a_03->infinity;
              secp256k1_ge_verify((secp256k1_ge *)a_04);
              return;
            }
          }
          else {
            secp256k1_ge_set_gej_zinv_cold_1();
          }
          secp256k1_ge_set_gej_zinv_cold_2();
          uVar2 = *(uint *)((long)(psVar95->x).n + 0x1c);
          psVar97->n[0] =
               (ulong)(*(byte *)((long)(psVar95->x).n + 0x19) & 0xf) << 0x30 |
               (ulong)CONCAT15(*(undefined1 *)((long)(psVar95->x).n + 0x1a),
                               CONCAT14(*(undefined1 *)((long)(psVar95->x).n + 0x1b),
                                        uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 |
                                        (uVar2 & 0xff00) << 8 | uVar2 << 0x18));
          psVar97->n[1] =
               (ulong)*(byte *)((long)(psVar95->x).n + 0x13) << 0x2c |
               (ulong)*(byte *)((long)(psVar95->x).n + 0x14) << 0x24 |
               (ulong)*(byte *)((long)(psVar95->x).n + 0x15) << 0x1c |
               (ulong)((uint)*(byte *)((long)(psVar95->x).n + 0x16) << 0x14 |
                      (uint)*(byte *)((long)(psVar95->x).n + 0x17) << 0xc |
                      (uint)(byte)(psVar95->x).n[3] << 4 |
                      (uint)(*(byte *)((long)(psVar95->x).n + 0x19) >> 4));
          uVar2 = *(uint *)((long)(psVar95->x).n + 0xf);
          psVar97->n[2] =
               (ulong)(*(byte *)((long)(psVar95->x).n + 0xc) & 0xf) << 0x30 |
               (ulong)CONCAT15(*(undefined1 *)((long)(psVar95->x).n + 0xd),
                               CONCAT14(*(undefined1 *)((long)(psVar95->x).n + 0xe),
                                        uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 |
                                        (uVar2 & 0xff00) << 8 | uVar2 << 0x18));
          psVar97->n[3] =
               (ulong)*(byte *)((long)(psVar95->x).n + 6) << 0x2c |
               (ulong)*(byte *)((long)(psVar95->x).n + 7) << 0x24 |
               (ulong)(byte)(psVar95->x).n[1] << 0x1c |
               (ulong)((uint)*(byte *)((long)(psVar95->x).n + 9) << 0x14 |
                      (uint)*(byte *)((long)(psVar95->x).n + 10) << 0xc |
                      (uint)*(byte *)((long)(psVar95->x).n + 0xb) << 4 |
                      (uint)(*(byte *)((long)(psVar95->x).n + 0xc) >> 4));
          uVar2 = *(uint *)((long)(psVar95->x).n + 2);
          psVar97->n[4] =
               (ulong)CONCAT15((char)(psVar95->x).n[0],
                               CONCAT14(*(undefined1 *)((long)(psVar95->x).n + 1),
                                        uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 |
                                        (uVar2 & 0xff00) << 8 | uVar2 << 0x18));
          return;
        }
        psStack_2d8 = (secp256k1_ge *)0x11d88f;
        a_04 = (secp256k1_gej *)auStack_2b0;
        secp256k1_fe_verify((secp256k1_fe *)auStack_2b0);
        if (8 < (int)auStack_2b0._40_4_) goto LAB_0011db64;
        a_05 = (secp256k1_fe *)(auStack_2b0 + 0x78);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = auStack_2b0._0_8_ * 2;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = auStack_2b0._24_8_;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = auStack_2b0._8_8_ * 2;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = auStack_2b0._16_8_;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = auStack_2b0._32_8_;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = auStack_2b0._32_8_;
        uVar89 = SUB168(auVar5 * auVar45,0);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar89 & 0xfffffffffffff;
        auVar23 = auVar4 * auVar44 + auVar3 * auVar43 + auVar6 * ZEXT816(0x1000003d10);
        uVar92 = auVar23._0_8_;
        auStack_2b0._72_8_ = uVar92 & 0xfffffffffffff;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = uVar92 >> 0x34 | auVar23._8_8_ << 0xc;
        uVar92 = auStack_2b0._32_8_ * 2;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = auStack_2b0._0_8_;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar92;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = auStack_2b0._8_8_ * 2;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = auStack_2b0._24_8_;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = auStack_2b0._16_8_;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = auStack_2b0._16_8_;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar89 >> 0x34 | SUB168(auVar5 * auVar45,8) << 0xc;
        auVar23 = auVar7 * auVar46 + auVar75 + auVar8 * auVar47 + auVar9 * auVar48 +
                  auVar10 * ZEXT816(0x1000003d10);
        auStack_2b0._64_8_ = auVar23._0_8_;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = (ulong)auStack_2b0._64_8_ >> 0x34 | auVar23._8_8_ << 0xc;
        auStack_2b0._56_8_ = (auStack_2b0._64_8_ & 0xfffffffffffff) >> 0x30;
        auStack_2b0._64_8_ = auStack_2b0._64_8_ & 0xffffffffffff;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = auStack_2b0._0_8_;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = auStack_2b0._0_8_;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = auStack_2b0._8_8_;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = uVar92;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = auStack_2b0._16_8_ * 2;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = auStack_2b0._24_8_;
        auVar23 = auVar12 * auVar50 + auVar76 + auVar13 * auVar51;
        uVar89 = auVar23._0_8_;
        auVar78._8_8_ = 0;
        auVar78._0_8_ = uVar89 >> 0x34 | auVar23._8_8_ << 0xc;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = (uVar89 & 0xfffffffffffff) << 4 | auStack_2b0._56_8_;
        auVar23 = auVar11 * auVar49 + ZEXT816(0x1000003d1) * auVar52;
        uVar89 = auVar23._0_8_;
        auStack_2b0._120_8_ = uVar89 & 0xfffffffffffff;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = uVar89 >> 0x34 | auVar23._8_8_ << 0xc;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = auStack_2b0._0_8_ * 2;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = auStack_2b0._8_8_;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = auStack_2b0._16_8_;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = uVar92;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = auStack_2b0._24_8_;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = auStack_2b0._24_8_;
        auVar24 = auVar15 * auVar54 + auVar78 + auVar16 * auVar55;
        uVar89 = auVar24._0_8_;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uVar89 & 0xfffffffffffff;
        auVar23 = auVar14 * auVar53 + auVar77 + auVar17 * ZEXT816(0x1000003d10);
        uVar91 = auVar23._0_8_;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = uVar89 >> 0x34 | auVar24._8_8_ << 0xc;
        uStack_230 = uVar91 & 0xfffffffffffff;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = uVar91 >> 0x34 | auVar23._8_8_ << 0xc;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = auStack_2b0._0_8_ * 2;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = auStack_2b0._16_8_;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = auStack_2b0._8_8_;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = auStack_2b0._8_8_;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = auStack_2b0._24_8_;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = uVar92;
        auVar80 = auVar20 * auVar58 + auVar80;
        uVar92 = auVar80._0_8_;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar92 & 0xfffffffffffff;
        auVar23 = auVar18 * auVar56 + auVar79 + auVar19 * auVar57 + auVar21 * ZEXT816(0x1000003d10);
        uVar89 = auVar23._0_8_;
        uStack_228 = uVar89 & 0xfffffffffffff;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = (uVar89 >> 0x34 | auVar23._8_8_ << 0xc) + auStack_2b0._72_8_;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar92 >> 0x34 | auVar80._8_8_ << 0xc;
        auVar81 = auVar22 * ZEXT816(0x1000003d10) + auVar81;
        uVar92 = auVar81._0_8_;
        uStack_220 = uVar92 & 0xfffffffffffff;
        lStack_218 = (uVar92 >> 0x34 | auVar81._8_8_ << 0xc) + auStack_2b0._64_8_;
        uStack_210 = 1;
        psStack_2d8 = (secp256k1_ge *)0x11daf7;
        puStack_2c0 = puVar100;
        psStack_2b8 = a_01;
        secp256k1_fe_verify(a_05);
        psVar97 = (secp256k1_fe *)(auStack_2b0 + 0x48);
        psStack_2d8 = (secp256k1_ge *)0x11db0a;
        secp256k1_fe_mul(psVar97,a_05,(secp256k1_fe *)auStack_2b0);
        psStack_2d8 = (secp256k1_ge *)0x11db18;
        secp256k1_fe_mul(&a_02->x,&a_02->x,a_05);
        a_03 = (secp256k1_gej *)&a_02->y;
        psStack_2d8 = (secp256k1_ge *)0x11db27;
        secp256k1_fe_mul((secp256k1_fe *)a_03,(secp256k1_fe *)a_03,psVar97);
        psStack_2d8 = (secp256k1_ge *)0x11db2f;
        secp256k1_ge_verify(a_02);
        psStack_2d8 = (secp256k1_ge *)0x11db37;
        secp256k1_ge_verify(a_02);
        puVar100 = puVar100 + 1;
        a_02 = a_02 + -1;
      } while (puStack_2c8 != puVar100);
    }
  }
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_ge *pre_a, secp256k1_fe *zr, secp256k1_fe *z, const secp256k1_gej *a) {
    secp256k1_gej d, ai;
    secp256k1_ge d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions using an isomorphic curve Y^2 = X^3 + 7*C^6 where C := d.z.
     * The isomorphism, phi, maps a secp256k1 point (x, y) to the point (x*C^2, y*C^3) on the other curve.
     * In Jacobian coordinates phi maps (x, y, z) to (x*C^2, y*C^3, z) or, equivalently to (x, y, z/C).
     *
     *     phi(x, y, z) = (x*C^2, y*C^3, z) = (x, y, z/C)
     *   d_ge := phi(d) = (d.x, d.y, 1)
     *     ai := phi(a) = (a.x*C^2, a.y*C^3, a.z)
     *
     * The group addition functions work correctly on these isomorphic curves.
     * In particular phi(d) is easy to represent in affine coordinates under this isomorphism.
     * This lets us use the faster secp256k1_gej_add_ge_var group addition function that we wouldn't be able to use otherwise.
     */
    secp256k1_ge_set_xy(&d_ge, &d.x, &d.y);
    secp256k1_ge_set_gej_zinv(&pre_a[0], a, &d.z);
    secp256k1_gej_set_ge(&ai, &pre_a[0]);
    ai.z = a->z;

    /* pre_a[0] is the point (a.x*C^2, a.y*C^3, a.z*C) which is equivalent to a.
     * Set zr[0] to C, which is the ratio between the omitted z(pre_a[0]) value and a.z.
     */
    zr[0] = d.z;

    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&ai, &ai, &d_ge, &zr[i]);
        secp256k1_ge_set_xy(&pre_a[i], &ai.x, &ai.y);
    }

    /* Multiply the last z-coordinate by C to undo the isomorphism.
     * Since the z-coordinates of the pre_a values are implied by the zr array of z-coordinate ratios,
     * undoing the isomorphism here undoes the isomorphism for all pre_a values.
     */
    secp256k1_fe_mul(z, &ai.z, &d.z);
}